

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_read_header(mtar_t *tar,mtar_header_t *h)

{
  undefined1 local_224 [8];
  mtar_raw_header_t rh;
  int err;
  mtar_header_t *h_local;
  mtar_t *tar_local;
  
  tar->last_header = tar->pos;
  unique0x10000073 = h;
  rh._padding._247_4_ = mtar_tread(tar,local_224,0x200);
  tar_local._4_4_ = rh._padding._247_4_;
  if ((rh._padding._247_4_ == 0) &&
     (rh._padding._247_4_ = mtar_seek(tar,tar->last_header), tar_local._4_4_ = rh._padding._247_4_,
     rh._padding._247_4_ == 0)) {
    tar_local._4_4_ = mtar_raw_to_header(stack0xffffffffffffffe0,(mtar_raw_header_t *)local_224);
  }
  return tar_local._4_4_;
}

Assistant:

int mtar_read_header(mtar_t *tar, mtar_header_t *h) {
  int err;
  mtar_raw_header_t rh;
  /* Save header position */
  tar->last_header = tar->pos;
  /* Read raw header */
  err = mtar_tread(tar, &rh, sizeof(rh));
  if (err) {
    return err;
  }
  /* Seek back to start of header */
  err = mtar_seek(tar, tar->last_header);
  if (err) {
    return err;
  }
  /* Load raw header into header struct and return */
  return mtar_raw_to_header(h, &rh);
}